

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition
          (MessageGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined8 uVar1;
  bool bVar2;
  LogMessage *pLVar3;
  Sub *local_bc8;
  basic_string_view<char,_std::char_traits<char>_> local_b00;
  LogMessageFatal local_af0 [21];
  Voidify local_adb [3];
  basic_string_view<char,_std::char_traits<char>_> local_ad8;
  undefined1 local_ac1;
  anon_class_16_2_fd512ddd_for_cb local_ac0;
  allocator<char> local_aa9;
  string local_aa8;
  anon_class_16_2_fd512ddd_for_cb local_a88;
  allocator<char> local_a71;
  string local_a70;
  anon_class_16_2_fd512ddd_for_cb local_a50;
  allocator<char> local_a39;
  string local_a38;
  anon_class_16_2_9185c52e_for_cb local_a18;
  allocator<char> local_a01;
  string local_a00;
  anon_class_16_2_fd512ddd_for_cb local_9e0;
  allocator<char> local_9c9;
  string local_9c8;
  anon_class_16_2_fd512ddd_for_cb local_9a8;
  allocator<char> local_991;
  string local_990;
  anon_class_16_2_fd512ddd_for_cb local_970;
  allocator<char> local_959;
  string local_958;
  anon_class_32_4_6322a670_for_cb local_938;
  allocator<char> local_911;
  string local_910;
  anon_class_16_2_fd512ddd_for_cb local_8f0;
  allocator<char> local_8d9;
  string local_8d8;
  anon_class_16_2_fd512ddd_for_cb local_8b8;
  allocator<char> local_8a1;
  string local_8a0;
  anon_class_16_2_fd512ddd_for_cb local_880 [2];
  allocator<char> local_859;
  string local_858;
  Sub *local_838;
  Sub local_830;
  Sub local_778;
  Sub local_6c0;
  Sub local_608;
  Sub local_550;
  Sub local_498;
  Sub local_3e0;
  Sub local_328;
  Sub local_270;
  Sub local_1b8;
  Sub local_100;
  iterator local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  undefined1 local_28 [8];
  size_t sizeof_has_bits;
  undefined8 uStack_18;
  bool need_to_emit_cached_size;
  Printer *p_local;
  MessageGenerator *this_local;
  
  uStack_18 = p;
  p_local = (Printer *)this;
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  sizeof_has_bits._7_1_ = !bVar2;
  local_28 = (undefined1  [8])HasBitsSize(this);
  uVar1 = uStack_18;
  local_ac1 = 1;
  local_838 = &local_830;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_858,"extension_set",&local_859);
  local_880[0].p = (Printer **)&stack0xffffffffffffffe8;
  local_880[0].this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition(google::protobuf::io::Printer*)::__0>
            (&local_830,&local_858,local_880);
  local_838 = &local_778;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"tracker",&local_8a1);
  local_8b8.p = (Printer **)&stack0xffffffffffffffe8;
  local_8b8.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition(google::protobuf::io::Printer*)::__1>
            (&local_778,&local_8a0,&local_8b8);
  local_838 = &local_6c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,"inlined_string_donated",&local_8d9);
  local_8f0.p = (Printer **)&stack0xffffffffffffffe8;
  local_8f0.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition(google::protobuf::io::Printer*)::__2>
            (&local_6c0,&local_8d8,&local_8f0);
  local_838 = &local_608;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_910,"has_bits",&local_911);
  local_938.p = (Printer **)&stack0xffffffffffffffe8;
  local_938.sizeof_has_bits = (size_t *)local_28;
  local_938.need_to_emit_cached_size = (bool *)((long)&sizeof_has_bits + 7);
  local_938.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition(google::protobuf::io::Printer*)::__3>
            (&local_608,&local_910,&local_938);
  local_838 = &local_550;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_958,"field_members",&local_959);
  local_970.p = (Printer **)&stack0xffffffffffffffe8;
  local_970.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition(google::protobuf::io::Printer*)::__4>
            (&local_550,&local_958,&local_970);
  local_838 = &local_498;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_990,"decl_split",&local_991);
  local_9a8.p = (Printer **)&stack0xffffffffffffffe8;
  local_9a8.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition(google::protobuf::io::Printer*)::__5>
            (&local_498,&local_990,&local_9a8);
  local_838 = &local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c8,"oneof_members",&local_9c9);
  local_9e0.p = (Printer **)&stack0xffffffffffffffe8;
  local_9e0.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition(google::protobuf::io::Printer*)::__6>
            (&local_3e0,&local_9c8,&local_9e0);
  local_838 = &local_328;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a00,"cached_size_if_no_hasbits",&local_a01);
  local_a18.need_to_emit_cached_size = (bool *)((long)&sizeof_has_bits + 7);
  local_a18.p = (Printer **)&stack0xffffffffffffffe8;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition(google::protobuf::io::Printer*)::__7>
            (&local_328,&local_a00,&local_a18);
  local_838 = &local_270;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"oneof_case",&local_a39);
  local_a50.p = (Printer **)&stack0xffffffffffffffe8;
  local_a50.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition(google::protobuf::io::Printer*)::__8>
            (&local_270,&local_a38,&local_a50);
  local_838 = &local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a70,"weak_field_map",&local_a71);
  local_a88.p = (Printer **)&stack0xffffffffffffffe8;
  local_a88.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition(google::protobuf::io::Printer*)::__9>
            (&local_1b8,&local_a70,&local_a88);
  local_838 = &local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa8,"union_impl",&local_aa9);
  local_ac0.p = (Printer **)&stack0xffffffffffffffe8;
  local_ac0.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateImplDefinition(google::protobuf::io::Printer*)::__10>
            (&local_100,&local_aa8,&local_ac0);
  local_ac1 = 0;
  local_48 = &local_830;
  local_40 = 0xb;
  v._M_len = 0xb;
  v._M_array = local_48;
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_38._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_ad8,
             "\n        struct Impl_ {\n          //~ TODO: check if/when there is a need for an\n          //~ outline dtor.\n          inline explicit constexpr Impl_(\n              ::$proto_ns$::internal::ConstantInitialized) noexcept;\n          inline explicit Impl_($pbi$::InternalVisibility visibility,\n                                ::$proto_ns$::Arena* arena);\n          inline explicit Impl_($pbi$::InternalVisibility visibility,\n                                ::$proto_ns$::Arena* arena, const Impl_& from,\n                                const $classname$& from_msg);\n          //~ Members assumed to align to 8 bytes:\n          $extension_set$;\n          $tracker$;\n          $inlined_string_donated$;\n          $has_bits$;\n          //~ Field members:\n          $field_members$;\n          $decl_split$;\n          $oneof_members$;\n          //~ Members assumed to align to 4 bytes:\n          $cached_size_if_no_hasbits$;\n          $oneof_case$;\n          $weak_field_map$;\n          //~ For detecting when concurrent accessor calls cause races.\n          PROTOBUF_TSAN_DECLARE_MEMBER\n        };\n        $union_impl$;\n      "
            );
  io::Printer::SourceLocation::current();
  google::protobuf::io::Printer::Emit
            (uVar1,local_38._M_allocated_capacity,local_38._8_8_,local_ad8._M_len,local_ad8._M_str);
  local_bc8 = (Sub *)&local_48;
  do {
    local_bc8 = local_bc8 + -1;
    io::Printer::Sub::~Sub(local_bc8);
  } while (local_bc8 != &local_830);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::allocator<char>::~allocator(&local_aa9);
  std::__cxx11::string::~string((string *)&local_a70);
  std::allocator<char>::~allocator(&local_a71);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator(&local_a39);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator(&local_a01);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator(&local_991);
  std::__cxx11::string::~string((string *)&local_958);
  std::allocator<char>::~allocator(&local_959);
  std::__cxx11::string::~string((string *)&local_910);
  std::allocator<char>::~allocator(&local_911);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator(&local_859);
  if ((sizeof_has_bits._7_1_ & 1) == 0) {
    return;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b00,"!need_to_emit_cached_size");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_af0,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
             ,0x63b,local_b00._M_len,local_b00._M_str);
  pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_af0);
  absl::lts_20240722::log_internal::Voidify::operator&&(local_adb,pLVar3);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_af0);
}

Assistant:

void MessageGenerator::GenerateImplDefinition(io::Printer* p) {
  // Prepare decls for _cached_size_ and _has_bits_.  Their position in the
  // output will be determined later.
  bool need_to_emit_cached_size = !HasSimpleBaseClass(descriptor_, options_);
  const size_t sizeof_has_bits = HasBitsSize();

  // To minimize padding, data members are divided into three sections:
  // (1) members assumed to align to 8 bytes
  // (2) members corresponding to message fields, re-ordered to optimize
  //     alignment.
  // (3) members assumed to align to 4 bytes.
  p->Emit(
      {{"extension_set",
        [&] {
          if (descriptor_->extension_range_count() == 0) return;

          p->Emit(R"cc(
            ::$proto_ns$::internal::ExtensionSet _extensions_;
          )cc");
        }},
       {"tracker",
        [&] {
          if (!HasTracker(descriptor_, options_)) return;

          p->Emit(R"cc(
            static ::$proto_ns$::AccessListener<$Msg$> _tracker_;
            static void TrackerOnGetMetadata() { $annotate_reflection$; }
          )cc");
        }},
       {"inlined_string_donated",
        [&] {
          // Generate _inlined_string_donated_ for inlined string type.
          // TODO: To avoid affecting the locality of
          // `_has_bits_`, should this be below or above `_has_bits_`?
          if (inlined_string_indices_.empty()) return;

          p->Emit({{"donated_size", InlinedStringDonatedSize()}},
                  R"cc(
                    ::$proto_ns$::internal::HasBits<$donated_size$>
                        _inlined_string_donated_;
                  )cc");
        }},
       {"has_bits",
        [&] {
          if (has_bit_indices_.empty()) return;

          // _has_bits_ is frequently accessed, so to reduce code size and
          // improve speed, it should be close to the start of the object.
          // Placing _cached_size_ together with _has_bits_ improves cache
          // locality despite potential alignment padding.
          p->Emit({{"sizeof_has_bits", sizeof_has_bits}}, R"cc(
            ::$proto_ns$::internal::HasBits<$sizeof_has_bits$> _has_bits_;
          )cc");
          if (need_to_emit_cached_size) {
            p->Emit(R"cc(
              ::$proto_ns$::internal::CachedSize _cached_size_;
            )cc");
            need_to_emit_cached_size = false;
          }
        }},
       {"field_members",
        [&] {
          // Emit some private and static members
          for (auto field : optimized_order_) {
            field_generators_.get(field).GenerateStaticMembers(p);
            if (!ShouldSplit(field, options_)) {
              field_generators_.get(field).GeneratePrivateMembers(p);
            }
          }
        }},
       {"decl_split",
        [&] {
          if (!ShouldSplit(descriptor_, options_)) return;
          p->Emit({{"split_field",
                    [&] {
                      for (auto field : optimized_order_) {
                        if (!ShouldSplit(field, options_)) continue;
                        field_generators_.get(field).GeneratePrivateMembers(p);
                      }
                    }}},
                  R"cc(
                    struct Split {
                      $split_field$;
                      using InternalArenaConstructable_ = void;
                      using DestructorSkippable_ = void;
                    };
                    static_assert(std::is_trivially_copy_constructible<Split>::value);
                    static_assert(std::is_trivially_destructible<Split>::value);
                    Split* _split_;
                  )cc");
        }},
       {"oneof_members",
        [&] {
          // For each oneof generate a union
          for (auto oneof : OneOfRange(descriptor_)) {
            // explicit empty constructor is needed when union contains
            // ArenaStringPtr members for string fields.
            p->Emit(
                {{"camel_oneof_name",
                  UnderscoresToCamelCase(oneof->name(), true)},
                 {"oneof_name", oneof->name()},
                 {"oneof_fields",
                  [&] {
                    for (auto field : FieldRange(oneof)) {
                      field_generators_.get(field).GeneratePrivateMembers(p);
                    }
                  }}},
                R"cc(
                  union $camel_oneof_name$Union {
                    constexpr $camel_oneof_name$Union() : _constinit_{} {}
                    ::$proto_ns$::internal::ConstantInitialized _constinit_;
                    $oneof_fields$;
                  } $oneof_name$_;
                )cc");
            for (auto field : FieldRange(oneof)) {
              field_generators_.get(field).GenerateStaticMembers(p);
            }
          }
        }},
       {"cached_size_if_no_hasbits",
        [&] {
          if (!need_to_emit_cached_size) return;

          need_to_emit_cached_size = false;
          p->Emit(R"cc(
            ::$proto_ns$::internal::CachedSize _cached_size_;
          )cc");
        }},
       {"oneof_case",
        [&] {
          // Generate _oneof_case_.
          if (descriptor_->real_oneof_decl_count() == 0) return;

          p->Emit({{"count", descriptor_->real_oneof_decl_count()}},
                  R"cc(
                    $uint32$ _oneof_case_[$count$];
                  )cc");
        }},
       {"weak_field_map",
        [&] {
          if (num_weak_fields_ == 0) return;

          p->Emit(R"cc(
            ::$proto_ns$::internal::WeakFieldMap _weak_field_map_;
          )cc");
        }},
       {"union_impl",
        [&] {
          // Only create the _impl_ field if it contains data.
          if (!HasImplData(descriptor_, options_)) return;

          // clang-format off
            p->Emit(R"cc(union { Impl_ _impl_; };)cc");
          // clang-format on
        }}},
      R"cc(
        struct Impl_ {
          //~ TODO: check if/when there is a need for an
          //~ outline dtor.
          inline explicit constexpr Impl_(
              ::$proto_ns$::internal::ConstantInitialized) noexcept;
          inline explicit Impl_($pbi$::InternalVisibility visibility,
                                ::$proto_ns$::Arena* arena);
          inline explicit Impl_($pbi$::InternalVisibility visibility,
                                ::$proto_ns$::Arena* arena, const Impl_& from,
                                const $classname$& from_msg);
          //~ Members assumed to align to 8 bytes:
          $extension_set$;
          $tracker$;
          $inlined_string_donated$;
          $has_bits$;
          //~ Field members:
          $field_members$;
          $decl_split$;
          $oneof_members$;
          //~ Members assumed to align to 4 bytes:
          $cached_size_if_no_hasbits$;
          $oneof_case$;
          $weak_field_map$;
          //~ For detecting when concurrent accessor calls cause races.
          PROTOBUF_TSAN_DECLARE_MEMBER
        };
        $union_impl$;
      )cc");

  ABSL_DCHECK(!need_to_emit_cached_size);
}